

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int buffsave(buffer *bp)

{
  buffer *pbVar1;
  int iVar2;
  mgwin *pmVar3;
  FILE *local_28;
  FILE *ffp;
  
  if ((bp->b_flag & 1U) == 0) {
    ewprintf("(No changes need to be saved)");
    iVar2 = 1;
  }
  else if (bp->b_fname[0] == '\0') {
    dobeep();
    iVar2 = 0;
    ewprintf("No file name");
  }
  else {
    iVar2 = fchecktime(bp);
    if ((iVar2 == 1) ||
       (iVar2 = eyesno("File has changed on disk since last save. Save anyway"), iVar2 == 1)) {
      if ((makebackup != 0) && ((bp->b_flag & 2U) != 0)) {
        iVar2 = fbackupfile(bp->b_fname);
        if (iVar2 == 2) {
          return 0;
        }
        if ((iVar2 == 0) && (iVar2 = eyesno("Backup error, save anyway"), iVar2 != 1)) {
          return iVar2;
        }
      }
      iVar2 = writeout(&local_28,bp,bp->b_fname);
      if (iVar2 == 1) {
        fupdstat(bp);
        bp->b_flag = bp->b_flag & 0xfc;
        if (wheadp != (mgwin *)0x0) {
          pbVar1 = curwp->w_bufp;
          pmVar3 = wheadp;
          do {
            if (pbVar1 == bp) {
              pmVar3->w_rflag = pmVar3->w_rflag | 0x10;
            }
            pmVar3 = (pmVar3->w_list).l_p.l_wp;
          } while (pmVar3 != (mgwin *)0x0);
        }
        iVar2 = 1;
        undo_add_boundary(8,1);
        undo_add_modified();
      }
    }
  }
  return iVar2;
}

Assistant:

int
buffsave(struct buffer *bp)
{
	int	 s;
        FILE    *ffp;

	/* return, no changes */
	if ((bp->b_flag & BFCHG) == 0) {
		ewprintf("(No changes need to be saved)");
		return (TRUE);
	}

	/* must have a name */
	if (bp->b_fname[0] == '\0') {
		dobeep();
		ewprintf("No file name");
		return (FALSE);
	}

	/* Ensure file has not been modified elsewhere */
	/* We don't use the ignore flag here */
	if (fchecktime(bp) != TRUE) {
		if ((s = eyesno("File has changed on disk since last save. "
		    "Save anyway")) != TRUE)
			return (s);
	}
	
	if (makebackup && (bp->b_flag & BFBAK)) {
		s = fbackupfile(bp->b_fname);
		/* hard error */
		if (s == ABORT)
			return (FALSE);
		/* softer error */
		if (s == FALSE &&
		    (s = eyesno("Backup error, save anyway")) != TRUE)
			return (s);
	}
	if ((s = writeout(&ffp, bp, bp->b_fname)) == TRUE) {
		(void)fupdstat(bp);
		bp->b_flag &= ~(BFCHG | BFBAK);
		upmodes(bp);
		undo_add_boundary(FFRAND, 1);
		undo_add_modified();
	}
	return (s);
}